

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O0

void __thiscall XPMP2::SoundSystemFMOD::SetMute(SoundSystemFMOD *this,uint64_t sndId,bool bMute)

{
  SoundChannel *pSVar1;
  byte in_DL;
  SoundChannel *pChn;
  undefined4 in_stack_fffffffffffffee0;
  int iVar2;
  uint64_t in_stack_fffffffffffffef0;
  SoundSystem *in_stack_fffffffffffffef8;
  string local_100 [16];
  FmodError *in_stack_ffffffffffffff10;
  char *in_stack_ffffffffffffff18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  string local_d8 [32];
  string *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  string *in_stack_ffffffffffffff58;
  string local_a0 [4];
  FMOD_RESULT in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  FmodError *in_stack_ffffffffffffff70;
  
  pSVar1 = SoundSystem::GetChn(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
  if ((pSVar1 != (SoundChannel *)0x0) && (pSVar1->pChn != (FMOD_CHANNEL *)0x0)) {
    pSVar1->bMuted = (bool)(in_DL & 1);
    gFmodRes = FMOD_Channel_SetMute(pSVar1->pChn,in_DL & 1);
    if (gFmodRes != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (allocator<char> *)in_stack_ffffffffffffff10);
      iVar2 = gFmodRes;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (allocator<char> *)in_stack_ffffffffffffff10);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                 (allocator<char> *)in_stack_ffffffffffffff10);
      FmodError::FmodError
                (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                 in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,in_stack_ffffffffffffff48);
      FmodError::LogErr(in_stack_ffffffffffffff10);
      FmodError::~FmodError((FmodError *)CONCAT44(iVar2,in_stack_fffffffffffffee0));
      std::__cxx11::string::~string(local_100);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeff);
      std::__cxx11::string::~string(local_d8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff27);
      std::__cxx11::string::~string(local_a0);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff5f);
    }
  }
  return;
}

Assistant:

void SoundSystemFMOD::SetMute (uint64_t sndId, bool bMute)
{
    SoundChannel* pChn = GetChn(sndId);
    if (!pChn || !pChn->pChn) return;

    pChn->bMuted = bMute;                   // Save its mute status
    FMOD_LOG(FMOD_Channel_SetMute(pChn->pChn, bMute));
}